

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlsbackend.cpp
# Opt level: O0

int __thiscall
QTlsBackend::dhParametersFromDer(QTlsBackend *this,QByteArray *derData,QByteArray *data)

{
  bool bVar1;
  QMessageLogger *in_RDX;
  QDebug *in_RSI;
  QString *in_RDI;
  long in_FS_OFFSET;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  QLoggingCategory *in_stack_ffffffffffffff78;
  QLoggingCategoryMacroHolder<(QtMsgType)1> *in_stack_ffffffffffffff80;
  int line;
  undefined1 local_58 [32];
  char *in_stack_ffffffffffffffc8;
  QDebug local_20;
  undefined8 local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::lcSsl();
  anon_unknown.dwarf_4f207b::QLoggingCategoryMacroHolder<(QtMsgType)1>::QLoggingCategoryMacroHolder
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  while( true ) {
    line = (int)((ulong)in_stack_ffffffffffffff80 >> 0x20);
    bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                      ((QLoggingCategoryMacroHolder *)&local_18);
    if (!bVar1) break;
    anon_unknown.dwarf_4f207b::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x277d1c);
    QMessageLogger::QMessageLogger
              (in_RDX,(char *)in_RDI,line,(char *)in_stack_ffffffffffffff78,(char *)0x277d32);
    QMessageLogger::warning();
    in_stack_ffffffffffffff80 =
         (QLoggingCategoryMacroHolder<(QtMsgType)1> *)
         QDebug::operator<<(in_RSI,in_stack_ffffffffffffffc8);
    (**(code **)&(in_RDI->d).d[9].super_QArrayData)(local_58);
    QDebug::operator<<((QDebug *)in_RDX,in_RDI);
    QDebug::operator<<(in_RSI,in_stack_ffffffffffffffc8);
    QString::~QString((QString *)0x277d92);
    QDebug::~QDebug(&local_20);
    local_10 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return 0;
  }
  __stack_chk_fail();
}

Assistant:

int QTlsBackend::dhParametersFromDer(const QByteArray &derData, QByteArray *data) const
{
    Q_UNUSED(derData);
    Q_UNUSED(data);
    REPORT_MISSING_SUPPORT("does not support QSslDiffieHellmanParameters in DER format");
    return {};
}